

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

TestSpecParser * __thiscall Catch::TestSpecParser::parse(TestSpecParser *this,string *arg)

{
  pointer puVar1;
  bool bVar2;
  ulong uVar3;
  string asStack_38 [32];
  
  this->m_mode = None;
  this->m_exclusion = false;
  (*this->m_tagAliases->_vptr_ITagAliasRegistry[3])(asStack_38,this->m_tagAliases,arg);
  std::__cxx11::string::operator=((string *)&this->m_arg,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  puVar1 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::__cxx11::string::reserve((ulong)&this->m_substring);
  std::__cxx11::string::reserve((ulong)&this->m_patternName);
  this->m_realPatternPos = 0;
  uVar3 = 0;
  do {
    this->m_pos = uVar3;
    if ((this->m_arg)._M_string_length <= uVar3) {
LAB_0019f504:
      endMode(this);
      return this;
    }
    bVar2 = visitChar(this,(this->m_arg)._M_dataplus._M_p[uVar3]);
    if (!bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->m_testSpec).m_invalidArgs,arg);
      goto LAB_0019f504;
    }
    uVar3 = this->m_pos + 1;
  } while( true );
}

Assistant:

TestSpecParser &TestSpecParser::parse(std::string const &arg) {
        m_mode = None;
        m_exclusion = false;
        m_arg = m_tagAliases->expandAliases(arg);
        m_escapeChars.clear();
        m_substring.reserve(m_arg.size());
        m_patternName.reserve(m_arg.size());
        m_realPatternPos = 0;

        for (m_pos = 0; m_pos < m_arg.size(); ++m_pos)
            //if visitChar fails
            if (!visitChar(m_arg[m_pos])) {
                m_testSpec.m_invalidArgs.push_back(arg);
                break;
            }
        endMode();
        return *this;
    }